

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<int>::GetSub(TPZMatrix<int> *this,TPZVec<long> *indices,TPZFMatrix<int> *block)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long row;
  long col;
  
  lVar1 = indices->fNElements;
  row = 0;
  lVar3 = 0;
  if (0 < lVar1) {
    lVar3 = lVar1;
  }
  for (; row != lVar3; row = row + 1) {
    for (col = 0; lVar1 != col; col = col + 1) {
      iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,indices->fStore[row],indices->fStore[col]);
      piVar4 = TPZFMatrix<int>::operator()(block,row,col);
      *piVar4 = iVar2;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}